

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktFragmentOperationsEarlyFragmentTests.cpp
# Opt level: O0

TestInstance * __thiscall
vkt::FragmentOperations::anon_unknown_1::EarlyFragmentTest::createInstance
          (EarlyFragmentTest *this,Context *context)

{
  InstanceInterface *pIVar1;
  VkPhysicalDevice pVVar2;
  NotSupportedError *this_00;
  EarlyFragmentTestInstance *this_01;
  allocator<char> local_119;
  string local_118;
  undefined1 local_f4 [8];
  VkPhysicalDeviceFeatures features;
  Context *context_local;
  EarlyFragmentTest *this_local;
  
  features._212_8_ = context;
  pIVar1 = Context::getInstanceInterface(context);
  pVVar2 = Context::getPhysicalDevice((Context *)features._212_8_);
  (*pIVar1->_vptr_InstanceInterface[2])(pIVar1,pVVar2,local_f4);
  if (features.pipelineStatisticsQuery == 0) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"Missing required feature: fragmentStoresAndAtomics",&local_119)
    ;
    tcu::NotSupportedError::NotSupportedError(this_00,&local_118);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  this_01 = (EarlyFragmentTestInstance *)operator_new(0x18);
  EarlyFragmentTestInstance::EarlyFragmentTestInstance
            (this_01,(Context *)features._212_8_,this->m_flags);
  return &this_01->super_TestInstance;
}

Assistant:

TestInstance* EarlyFragmentTest::createInstance (Context& context) const
{
	// Check required features
	{
		VkPhysicalDeviceFeatures features;
		context.getInstanceInterface().getPhysicalDeviceFeatures(context.getPhysicalDevice(), &features);

		// SSBO writes in fragment shader
		if (!features.fragmentStoresAndAtomics)
			throw tcu::NotSupportedError("Missing required feature: fragmentStoresAndAtomics");
	}

	return new EarlyFragmentTestInstance(context, m_flags);
}